

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

void __thiscall lest::got::got(got *this,location *where_,text *expr_,text *excpt_)

{
  allocator local_101;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [48];
  location local_90;
  string local_68 [32];
  string local_48 [32];
  text *local_28;
  text *excpt__local;
  text *expr__local;
  location *where__local;
  got *this_local;
  
  local_28 = excpt_;
  excpt__local = expr_;
  expr__local = &where_->file;
  where__local = (location *)this;
  std::operator+((char *)local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "passed: got exception ");
  std::__cxx11::string::string(local_48,local_68);
  location::location(&local_90,where_);
  std::__cxx11::string::string(local_c0,(string *)expr_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"",&local_101);
  std::__cxx11::string::string(local_e0,local_100);
  success::success(&this->super_success,(text *)local_48,&local_90,(text *)local_c0,(text *)local_e0
                  );
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  std::__cxx11::string::~string(local_c0);
  location::~location(&local_90);
  std::__cxx11::string::~string(local_48);
  std::__cxx11::string::~string(local_68);
  *(undefined ***)&(this->super_success).super_message = &PTR__got_0021dd48;
  return;
}

Assistant:

got( location where_, text expr_, text excpt_)
    : success( "passed: got exception " + excpt_, where_, expr_) {}